

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_text(nk_text_edit *state,char *text,int total_len)

{
  nk_str *str;
  int iVar1;
  int iVar2;
  nk_rune nVar3;
  nk_rune *pnVar4;
  nk_str *pnVar5;
  int iVar6;
  nk_rune unicode;
  char *local_48;
  nk_str *local_40;
  nk_text_undo_state *local_38;
  
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x553f,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
  }
  local_48 = text;
  if (text != (char *)0x0) {
    if ((total_len != 0) && (state->mode != '\0')) {
      iVar1 = nk_utf_decode(text,&unicode,total_len);
      str = &state->string;
      local_38 = &state->undo;
      iVar6 = 0;
      local_40 = str;
      while ((iVar6 < total_len && (iVar1 != 0))) {
        if (((unicode != 0x7f) && ((unicode != 10 || (state->single_line == '\0')))) &&
           ((state->filter == (nk_plugin_filter)0x0 ||
            (iVar2 = (*state->filter)(state,unicode), iVar2 != 0)))) {
          if ((state->select_start == state->select_end) &&
             (iVar2 = state->cursor, iVar2 < (state->string).len)) {
            pnVar5 = str;
            if (state->mode == '\x02') {
              pnVar4 = nk_textedit_createundo(local_38,iVar2,1,1);
              if (pnVar4 != (nk_rune *)0x0) {
                nVar3 = nk_str_rune_at(local_40,iVar2);
                *pnVar4 = nVar3;
                pnVar5 = local_40;
              }
              nk_str_delete_runes(pnVar5,state->cursor,1);
              iVar2 = state->cursor;
              pnVar5 = local_40;
            }
            nk_str_insert_text_utf8(pnVar5,iVar2,local_48 + iVar6,1);
          }
          else {
            nk_textedit_delete_selection(state);
            nk_str_insert_text_utf8(str,state->cursor,local_48 + iVar6,1);
            nk_textedit_makeundo_insert(state,state->cursor,1);
          }
          state->cursor = state->cursor + 1;
          state->has_preferred_x = '\0';
        }
        iVar6 = iVar6 + iVar1;
        iVar1 = nk_utf_decode(local_48 + iVar6,&unicode,total_len - iVar6);
      }
    }
    return;
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x5540,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
}

Assistant:

NK_API void
nk_textedit_text(struct nk_text_edit *state, const char *text, int total_len)
{
    nk_rune unicode;
    int glyph_len;
    int text_len = 0;

    NK_ASSERT(state);
    NK_ASSERT(text);
    if (!text || !total_len || state->mode == NK_TEXT_EDIT_MODE_VIEW) return;

    glyph_len = nk_utf_decode(text, &unicode, total_len);
    while ((text_len < total_len) && glyph_len)
    {
        /* don't insert a backward delete, just process the event */
        if (unicode == 127) goto next;
        /* can't add newline in single-line mode */
        if (unicode == '\n' && state->single_line) goto next;
        /* filter incoming text */
        if (state->filter && !state->filter(state, unicode)) goto next;

        if (!NK_TEXT_HAS_SELECTION(state) &&
            state->cursor < state->string.len)
        {
            if (state->mode == NK_TEXT_EDIT_MODE_REPLACE) {
                nk_textedit_makeundo_replace(state, state->cursor, 1, 1);
                nk_str_delete_runes(&state->string, state->cursor, 1);
            }
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        } else {
            nk_textedit_delete_selection(state); /* implicitly clamps */
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                nk_textedit_makeundo_insert(state, state->cursor, 1);
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        }
        next:
        text_len += glyph_len;
        glyph_len = nk_utf_decode(text + text_len, &unicode, total_len-text_len);
    }
}